

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_read_file_header_0(archive_read *a,lha *lha)

{
  byte bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  time_t tVar7;
  void *pp;
  char *pcVar8;
  void *in_RSI;
  archive *in_RDI;
  uchar *unaff_retaddr;
  uchar sum_calculated;
  uchar headersum;
  wchar_t namelen;
  wchar_t extdsize;
  uchar *p;
  size_t in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  byte bVar9;
  wchar_t local_4;
  
  pbVar6 = (byte *)__archive_read_ahead
                             ((archive_read *)
                              CONCAT17(in_stack_ffffffffffffffd7,
                                       CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)
                                      ),in_stack_ffffffffffffffc8,(ssize_t *)0x1422a1);
  if (pbVar6 == (byte *)0x0) {
    local_4 = truncated_error((archive_read *)0x1422b6);
  }
  else {
    *(long *)((long)in_RSI + 0x20) = (long)(int)(*pbVar6 + 2);
    bVar9 = pbVar6[1];
    uVar3 = archive_le32dec(pbVar6 + 7);
    *(ulong *)((long)in_RSI + 0x30) = (ulong)uVar3;
    uVar3 = archive_le32dec(pbVar6 + 0xb);
    *(ulong *)((long)in_RSI + 0x38) = (ulong)uVar3;
    tVar7 = lha_dos_time(unaff_retaddr);
    *(time_t *)((long)in_RSI + 0x58) = tVar7;
    uVar4 = (uint)pbVar6[0x15];
    iVar5 = ((int)*(undefined8 *)((long)in_RSI + 0x20) + -0x18) - uVar4;
    if (((uVar4 < 0xde) && (-1 < iVar5)) || (iVar5 == -2)) {
      pp = __archive_read_ahead
                     ((archive_read *)
                      CONCAT17(bVar9,CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)),
                      in_stack_ffffffffffffffc8,(ssize_t *)0x1423a7);
      if (pp == (void *)0x0) {
        local_4 = truncated_error((archive_read *)0x1423bc);
      }
      else {
        *(undefined8 *)((long)in_RSI + 0xf8) = 0;
        archive_strncat((archive_string *)in_RDI,in_RSI,(size_t)pp);
        if (-1 < iVar5) {
          uVar2 = archive_le16dec((void *)((long)pp + (long)(int)uVar4 + 0x16));
          *(uint16_t *)((long)in_RSI + 0xc2) = uVar2;
          *(uint *)((long)in_RSI + 0x40) = *(uint *)((long)in_RSI + 0x40) | 8;
        }
        bVar1 = lha_calcsum('\0',pp,L'\x02',*(long *)((long)in_RSI + 0x20) - 2);
        if (((0 < iVar5) &&
            (pcVar8 = (char *)((long)pp + (long)(int)(uVar4 + 0x18)), *pcVar8 == 'U')) &&
           (iVar5 == 0xc)) {
          uVar3 = archive_le32dec(pcVar8 + 2);
          *(ulong *)((long)in_RSI + 0x58) = (ulong)uVar3;
          uVar2 = archive_le16dec(pcVar8 + 6);
          *(uint *)((long)in_RSI + 0x78) = (uint)uVar2;
          uVar2 = archive_le16dec(pcVar8 + 8);
          *(ulong *)((long)in_RSI + 0x80) = (ulong)uVar2;
          uVar2 = archive_le16dec(pcVar8 + 10);
          *(ulong *)((long)in_RSI + 0x88) = (ulong)uVar2;
          *(uint *)((long)in_RSI + 0x40) = *(uint *)((long)in_RSI + 0x40) | 4;
        }
        __archive_read_consume
                  ((archive_read *)CONCAT17(bVar9,CONCAT16(bVar1,in_stack_ffffffffffffffd0)),
                   in_stack_ffffffffffffffc8);
        if (bVar1 == bVar9) {
          local_4 = L'\0';
        }
        else {
          archive_set_error(in_RDI,-1,"LHa header sum error");
          local_4 = L'\xffffffe2';
        }
      }
    }
    else {
      archive_set_error(in_RDI,0x54,"Invalid LHa header");
      local_4 = L'\xffffffe2';
    }
  }
  return local_4;
}

Assistant:

static int
lha_read_file_header_0(struct archive_read *a, struct lha *lha)
{
	const unsigned char *p;
	int extdsize, namelen;
	unsigned char headersum, sum_calculated;

	if ((p = __archive_read_ahead(a, H0_FIXED_SIZE, NULL)) == NULL)
		return (truncated_error(a));
	lha->header_size = p[H0_HEADER_SIZE_OFFSET] + 2;
	headersum = p[H0_HEADER_SUM_OFFSET];
	lha->compsize = archive_le32dec(p + H0_COMP_SIZE_OFFSET);
	lha->origsize = archive_le32dec(p + H0_ORIG_SIZE_OFFSET);
	lha->mtime = lha_dos_time(p + H0_DOS_TIME_OFFSET);
	namelen = p[H0_NAME_LEN_OFFSET];
	extdsize = (int)lha->header_size - H0_FIXED_SIZE - namelen;
	if ((namelen > 221 || extdsize < 0) && extdsize != -2) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Invalid LHa header");
		return (ARCHIVE_FATAL);
	}
	if ((p = __archive_read_ahead(a, lha->header_size, NULL)) == NULL)
		return (truncated_error(a));

	archive_strncpy(&lha->filename, p + H0_FILE_NAME_OFFSET, namelen);
	/* When extdsize == -2, A CRC16 value is not present in the header. */
	if (extdsize >= 0) {
		lha->crc = archive_le16dec(p + H0_FILE_NAME_OFFSET + namelen);
		lha->setflag |= CRC_IS_SET;
	}
	sum_calculated = lha_calcsum(0, p, 2, lha->header_size - 2);

	/* Read an extended header */
	if (extdsize > 0) {
		/* This extended data is set by 'LHa for UNIX' only.
		 * Maybe fixed size.
		 */
		p += H0_FILE_NAME_OFFSET + namelen + 2;
		if (p[0] == 'U' && extdsize == 12) {
			/* p[1] is a minor version. */
			lha->mtime = archive_le32dec(&p[2]);
			lha->mode = archive_le16dec(&p[6]);
			lha->uid = archive_le16dec(&p[8]);
			lha->gid = archive_le16dec(&p[10]);
			lha->setflag |= UNIX_MODE_IS_SET;
		}
	}
	__archive_read_consume(a, lha->header_size);

	if (sum_calculated != headersum) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "LHa header sum error");
		return (ARCHIVE_FATAL);
	}

	return (ARCHIVE_OK);
}